

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O1

FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *
google::protobuf::compiler::java::MakeImmutableFieldGenerators
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
           *__return_storage_ptr__,Descriptor *descriptor,Context *context)

{
  byte bVar1;
  bool bVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  ImmutableEnumFieldGenerator *this;
  Descriptor *pDVar6;
  Nonnull<const_char_*> failure_msg;
  int builderBitIndex;
  long lVar7;
  long lVar8;
  FieldDescriptor *pFVar9;
  int local_6c;
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false> local_60;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_58;
  Descriptor *local_50;
  long local_48;
  LogMessageFatal local_40;
  
  local_58 = __return_storage_ptr__;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (__return_storage_ptr__,descriptor);
  if (0 < descriptor->field_count_) {
    lVar7 = 0;
    lVar8 = 0;
    local_6c = 0;
    builderBitIndex = 0;
    local_50 = descriptor;
    do {
      pFVar9 = local_50->fields_;
      bVar1 = (&pFVar9->field_0x1)[lVar7];
      bVar2 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 == bVar2) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar2,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      pFVar9 = (FieldDescriptor *)(&pFVar9->super_SymbolBase + lVar7);
      local_48 = lVar7;
      if ((pFVar9->field_0x1 & 0x20) == 0) {
        bVar2 = IsRealOneof(pFVar9);
        if (bVar2) {
          JVar3 = GetJavaType(pFVar9);
          if (JVar3 == JAVATYPE_STRING) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableStringOneofFieldGenerator::ImmutableStringOneofFieldGenerator
                      ((ImmutableStringOneofFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                       context);
          }
          else if (JVar3 == JAVATYPE_ENUM) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
                      ((ImmutableEnumOneofFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                       context);
          }
          else if (JVar3 == JAVATYPE_MESSAGE) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableMessageOneofFieldGenerator::ImmutableMessageOneofFieldGenerator
                      ((ImmutableMessageOneofFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                       context);
          }
          else {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator
                      ((ImmutablePrimitiveOneofFieldGenerator *)this,pFVar9,local_6c,builderBitIndex
                       ,context);
          }
        }
        else {
          JVar3 = GetJavaType(pFVar9);
          if (JVar3 == JAVATYPE_STRING) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
                      ((ImmutableStringFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,context
                      );
          }
          else if (JVar3 == JAVATYPE_ENUM) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
                      (this,pFVar9,local_6c,builderBitIndex,context);
          }
          else if (JVar3 == JAVATYPE_MESSAGE) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
                      ((ImmutableMessageFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                       context);
          }
          else {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
                      ((ImmutablePrimitiveFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                       context);
          }
        }
      }
      else {
        JVar3 = GetJavaType(pFVar9);
        if (JVar3 == JAVATYPE_STRING) {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator
                    ((RepeatedImmutableStringFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                     context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutableEnumFieldGenerator::RepeatedImmutableEnumFieldGenerator
                    ((RepeatedImmutableEnumFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,
                     context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar6 = FieldDescriptor::message_type(pFVar9);
          if ((pDVar6->options_->field_0)._impl_.map_entry_ == true) {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
                      ((ImmutableMapFieldGenerator *)this,pFVar9,local_6c,builderBitIndex,context);
          }
          else {
            this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
            RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator
                      ((RepeatedImmutableMessageFieldGenerator *)this,pFVar9,local_6c,
                       builderBitIndex,context);
          }
        }
        else {
          this = (ImmutableEnumFieldGenerator *)operator_new(0x48);
          RepeatedImmutablePrimitiveFieldGenerator::RepeatedImmutablePrimitiveFieldGenerator
                    ((RepeatedImmutablePrimitiveFieldGenerator *)this,pFVar9,local_6c,
                     builderBitIndex,context);
        }
      }
      iVar4 = (*(((ImmutableMessageFieldGenerator *)&this->super_ImmutableFieldGenerator)->
                super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[5])(this);
      iVar5 = (*(((ImmutableMessageFieldGenerator *)&this->super_ImmutableFieldGenerator)->
                super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[6])(this);
      local_60._M_head_impl = &this->super_ImmutableFieldGenerator;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
                (local_58,pFVar9,
                 (unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                  *)&local_60);
      if ((ImmutableEnumFieldGenerator *)local_60._M_head_impl != (ImmutableEnumFieldGenerator *)0x0
         ) {
        (*(((ImmutableMessageFieldGenerator *)&(local_60._M_head_impl)->super_FieldGenerator)->
          super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[1])();
      }
      local_6c = local_6c + iVar4;
      builderBitIndex = builderBitIndex + iVar5;
      local_60._M_head_impl = (ImmutableFieldGenerator *)0x0;
      lVar8 = lVar8 + 1;
      lVar7 = local_48 + 0x58;
    } while (lVar8 < local_50->field_count_);
  }
  return local_58;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator> MakeImmutableFieldGenerators(
    const Descriptor* descriptor, Context* context) {
  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  FieldGeneratorMap<ImmutableFieldGenerator> ret(descriptor);
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    auto generator = MakeImmutableGenerator(field, messageBitIndex,
                                            builderBitIndex, context);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
    ret.Add(field, std::move(generator));
  }
  return ret;
}